

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O1

void __thiscall ProjectWriter::writeControls(ProjectWriter *this)

{
  pointer ppCVar1;
  ostream *poVar2;
  pointer ppCVar3;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x18,"\n[CONTROLS]\n",0xc);
  ppCVar1 = (this->network->controls).super__Vector_base<Control_*,_std::allocator<Control_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar3 = (this->network->controls).super__Vector_base<Control_*,_std::allocator<Control_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar1;
      ppCVar3 = ppCVar3 + 1) {
    Control::toStr_abi_cxx11_(&local_50,*ppCVar3,this->network);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x18,local_50._M_dataplus._M_p,
                        local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeControls()
{
    fout << "\n[CONTROLS]\n";
    for (Control* control : network->controls)
    {
        fout << control->toStr(network) << "\n";
    }
}